

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::InitWalletFlags(CWallet *this,uint64_t flags)

{
  bool bVar1;
  WalletDatabase *pWVar2;
  runtime_error *this_00;
  long in_FS_OFFSET;
  allocator<char> local_79;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock36,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x6d5,false);
  if (flags >> 0x24 != 0) {
    __assert_fail("((flags & KNOWN_WALLET_FLAGS) >> 32) == (flags >> 32)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x6d8,"void wallet::CWallet::InitWalletFlags(uint64_t)");
  }
  if ((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i != 0) {
    __assert_fail("m_wallet_flags == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x6da,"void wallet::CWallet::InitWalletFlags(uint64_t)");
  }
  pWVar2 = GetDatabase(this);
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_48,pWVar2,1);
  local_48._M_string_length = (size_type)pWVar2;
  bVar1 = WalletBatch::WriteWalletFlags((WalletBatch *)&local_48,flags);
  if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_dataplus._M_p + 0x28))();
  }
  if (bVar1) {
    bVar1 = LoadWalletFlags(this,flags);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x6e0,"void wallet::CWallet::InitWalletFlags(uint64_t)");
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock36.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"InitWalletFlags",&local_79);
    std::operator+(&local_48,&local_68,": writing wallet flags failed");
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::InitWalletFlags(uint64_t flags)
{
    LOCK(cs_wallet);

    // We should never be writing unknown non-tolerable wallet flags
    assert(((flags & KNOWN_WALLET_FLAGS) >> 32) == (flags >> 32));
    // This should only be used once, when creating a new wallet - so current flags are expected to be blank
    assert(m_wallet_flags == 0);

    if (!WalletBatch(GetDatabase()).WriteWalletFlags(flags)) {
        throw std::runtime_error(std::string(__func__) + ": writing wallet flags failed");
    }

    if (!LoadWalletFlags(flags)) assert(false);
}